

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
::
binary_search_impl<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
           *this,FileEntry *k,size_type s,checked_compare *e,checked_compare *comp)

{
  bool bVar1;
  checked_compare *i;
  key_type *lhs;
  size_type mid;
  checked_compare *comp_local;
  size_type e_local;
  size_type s_local;
  FileEntry *k_local;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
  *this_local;
  SearchResult<unsigned_long,_false> local_10;
  
  i = e;
  e_local = s;
  while (comp_local = i, (checked_compare *)e_local != comp_local) {
    i = (checked_compare *)
        ((long)&(comp_local->
                super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                ).super_FileCompare.index + e_local >> 1);
    lhs = btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
          ::key((btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                 *)this,(size_type)i);
    bVar1 = key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
            ::checked_compare::
            operator()<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_0>
                      (comp,lhs,k);
    if (bVar1) {
      e_local = (long)&(i->
                       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                       ).super_FileCompare.index + 1;
      i = comp_local;
    }
  }
  SearchResult<unsigned_long,_false>::SearchResult(&local_10,e_local);
  return (SearchResult<unsigned_long,_false>)local_10.value;
}

Assistant:

SearchResult<size_type, false> binary_search_impl(
      const K &k, size_type s, size_type e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s != e) {
      const size_type mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return SearchResult<size_type, false>{s};
  }